

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool __thiscall family::operator==(family *this,family *rhs)

{
  bool bVar1;
  tuple<const_std::pair<person,_person>_&,_const_std::vector<person,_std::allocator<person>_>_&,_const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_&>
  local_48;
  tuple<const_std::pair<person,_person>_&,_const_std::vector<person,_std::allocator<person>_>_&,_const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_&>
  local_30;
  family *local_18;
  family *rhs_local;
  family *this_local;
  
  local_18 = rhs;
  rhs_local = this;
  as_tuple_abi_cxx11_<family_const&,void>(&local_30,this);
  as_tuple_abi_cxx11_<family_const&,void>(&local_48,local_18);
  bVar1 = std::operator==(&local_30,&local_48);
  return bVar1;
}

Assistant:

bool operator==(family const& rhs) const noexcept {
        return as_tuple(*this) == as_tuple(rhs);
    }